

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamReaderPrivate::BamReaderPrivate(BamReaderPrivate *this,BamReader *parent)

{
  _Alloc_hider _Var1;
  size_type in_RSI;
  BamHeader *in_RDI;
  BamRandomAccessController *in_stack_ffffffffffffffb0;
  BgzfStream *this_00;
  
  *(undefined8 *)&(in_RDI->m_header).Version = 0;
  this_00 = (BgzfStream *)&(in_RDI->m_header).Version._M_string_length;
  std::__cxx11::string::string((string *)this_00);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)0x2c3280);
  (in_RDI->m_header).GroupOrder._M_string_length = in_RSI;
  BamHeader::BamHeader(in_RDI);
  BamRandomAccessController::BamRandomAccessController(in_stack_ffffffffffffffb0);
  BgzfStream::BgzfStream(this_00);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].m_header.ReadGroups.m_data.
              super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  _Var1 = (_Alloc_hider)SystemIsBigEndian();
  (in_RDI->m_header).GroupOrder._M_dataplus = _Var1;
  return;
}

Assistant:

BamReaderPrivate::BamReaderPrivate(BamReader* parent)
    : m_alignmentsBeginOffset(0)
    , m_parent(parent)
{
    m_isBigEndian = BamTools::SystemIsBigEndian();
}